

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Char * Diligent::GetComparisonFunctionLiteralName
                 (COMPARISON_FUNCTION ComparisonFunc,bool bGetFullName)

{
  Char *Message;
  char (*in_R8) [2];
  uint local_3c;
  undefined1 local_38 [8];
  string msg;
  bool bGetFullName_local;
  char *pcStack_10;
  COMPARISON_FUNCTION ComparisonFunc_local;
  
  switch(ComparisonFunc) {
  case COMPARISON_FUNC_UNKNOWN:
    pcStack_10 = "unknown";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_UNKNOWN";
    }
    break;
  case COMPARISON_FUNC_NEVER:
    pcStack_10 = "never";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_NEVER";
    }
    break;
  case COMPARISON_FUNC_LESS:
    pcStack_10 = "less";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_LESS";
    }
    break;
  case COMPARISON_FUNC_EQUAL:
    pcStack_10 = "equal";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_EQUAL";
    }
    break;
  case COMPARISON_FUNC_LESS_EQUAL:
    pcStack_10 = "less equal";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_LESS_EQUAL";
    }
    break;
  case COMPARISON_FUNC_GREATER:
    pcStack_10 = "greater";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_GREATER";
    }
    break;
  case COMPARISON_FUNC_NOT_EQUAL:
    pcStack_10 = "not equal";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_NOT_EQUAL";
    }
    break;
  case COMPARISON_FUNC_GREATER_EQUAL:
    pcStack_10 = "greater equal";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_GREATER_EQUAL";
    }
    break;
  case COMPARISON_FUNC_ALWAYS:
    pcStack_10 = "always";
    if (bGetFullName) {
      pcStack_10 = "COMPARISON_FUNC_ALWAYS";
    }
    break;
  default:
    local_3c = (uint)ComparisonFunc;
    msg.field_2._M_local_buf[0xe] = bGetFullName;
    msg.field_2._M_local_buf[0xf] = ComparisonFunc;
    FormatString<char[33],unsigned_int,char[2]>
              ((string *)local_38,(Diligent *)"Unexpected comparison function (",
               (char (*) [33])&local_3c,(uint *)0xf65f2d,in_R8);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetComparisonFunctionLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x3b3);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const Char* GetComparisonFunctionLiteralName(COMPARISON_FUNCTION ComparisonFunc, bool bGetFullName)
{
    static_assert(COMPARISON_FUNC_NUM_FUNCTIONS == 9, "Please update the switch below to handle the new comparison function");
    switch (ComparisonFunc)
    {
        // clang-format off
        case COMPARISON_FUNC_UNKNOWN:       return bGetFullName ? "COMPARISON_FUNC_UNKNOWN"      : "unknown";
        case COMPARISON_FUNC_NEVER:         return bGetFullName ? "COMPARISON_FUNC_NEVER"        : "never";
        case COMPARISON_FUNC_LESS:          return bGetFullName ? "COMPARISON_FUNC_LESS"         : "less";
        case COMPARISON_FUNC_EQUAL:         return bGetFullName ? "COMPARISON_FUNC_EQUAL"        : "equal";
        case COMPARISON_FUNC_LESS_EQUAL:    return bGetFullName ? "COMPARISON_FUNC_LESS_EQUAL"   : "less equal";
        case COMPARISON_FUNC_GREATER:       return bGetFullName ? "COMPARISON_FUNC_GREATER"      : "greater";
        case COMPARISON_FUNC_NOT_EQUAL:     return bGetFullName ? "COMPARISON_FUNC_NOT_EQUAL"    : "not equal";
        case COMPARISON_FUNC_GREATER_EQUAL: return bGetFullName ? "COMPARISON_FUNC_GREATER_EQUAL": "greater equal";
        case COMPARISON_FUNC_ALWAYS:        return bGetFullName ? "COMPARISON_FUNC_ALWAYS"       : "always";
        // clang-format on
        default:
            UNEXPECTED("Unexpected comparison function (", Uint32{ComparisonFunc}, ")");
            return "UNKNOWN";
    }
}